

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node>::push_back
          (vector<basisu::tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node> *this,
          tsvq_node *obj)

{
  uint uVar1;
  tsvq_node *ptVar2;
  ulong uVar3;
  
  ptVar2 = this->m_p;
  uVar1 = this->m_size;
  uVar3 = (ulong)uVar1;
  if (ptVar2 + uVar3 <= obj || (obj < ptVar2 || ptVar2 == (tsvq_node *)0x0)) {
    if (this->m_capacity <= uVar1) {
      increase_capacity(this,uVar1 + 1,true,false);
      ptVar2 = this->m_p;
      uVar3 = (ulong)this->m_size;
    }
    tree_vector_quant<basisu::vec<6U,_float>_>::tsvq_node::tsvq_node(ptVar2 + uVar3,obj);
    this->m_size = this->m_size + 1;
    return;
  }
  __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x267,
                "void basisu::vector<basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node>::push_back(const T &) [T = basisu::tree_vector_quant<basisu::vec<6, float>>::tsvq_node]"
               );
}

Assistant:

BASISU_FORCE_INLINE void push_back(const T& obj)
      {
         assert(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
            increase_capacity(m_size + 1, true);

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;
      }